

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

void __thiscall blc::tools::VFile::refresh(VFile *this)

{
  bool bVar1;
  undefined1 uVar2;
  istream *piVar3;
  long lVar4;
  undefined8 uVar5;
  int __oflag;
  string *psVar6;
  VFile *in_RDI;
  string completFile;
  string ligne;
  string *in_stack_000000f8;
  exception *in_stack_00000100;
  char *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_78 [48];
  string local_48 [32];
  string local_28 [40];
  
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(&in_RDI->_file + *(long *)(*(long *)&in_RDI->_file + -0x18)));
  if (!bVar1) {
    uVar5 = __cxa_allocate_exception(0x78);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    error::exception::exception(in_stack_00000100,in_stack_000000f8);
    __cxa_throw(uVar5,&error::exception::typeinfo,error::exception::~exception);
  }
  std::__cxx11::string::string(local_28);
  std::__cxx11::string::string(local_48);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in_RDI->_file,local_28);
    uVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!(bool)uVar2) break;
    std::operator+(in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffff28),in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=(local_48,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar6 = local_48;
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)psVar6,lVar4 - 1);
  }
  psVar6 = local_48;
  std::__cxx11::string::operator=((string *)&in_RDI->_cache,psVar6);
  open(in_RDI,(char *)psVar6,__oflag);
  in_RDI->_cursor = 0;
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void blc::tools::VFile::refresh() {
	if (this->_file) {
		std::string ligne;
		std::string completFile;
		while(getline(this->_file, ligne)) {
			completFile = completFile + ligne + "\n";
		}
		if (completFile.size() > 0)
			completFile.erase(completFile.size()-1);
		this->_cache = completFile;
		this->open();
		this->_cursor = 0;
	} else {
		throw blc::error::exception("Impossible to open file " + this->_fileName);
	}
}